

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowFontAtlas(ImFontAtlas *atlas)

{
  bool bVar1;
  ImVec4 *pIVar2;
  long in_RDI;
  ImFont *unaff_retaddr;
  ImVec4 border_col;
  ImVec4 tint_col;
  ImGuiMetricsConfig *cfg;
  ImGuiContext *g;
  ImFont *font;
  ImFont **__end1;
  ImFont **__begin1;
  ImVector<ImFont_*> *__range1;
  bool *in_stack_000000c0;
  char *in_stack_000000c8;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 in_stack_ffffffffffffffa0;
  ImVec4 local_48;
  ImGuiMetricsConfig *local_38;
  ImGuiContext *local_30;
  ImFont *local_28;
  ImFont **local_20;
  ImFont **local_18;
  ImVector<ImFont_*> *local_10;
  long local_8;
  
  local_10 = (ImVector<ImFont_*> *)(in_RDI + 0x58);
  local_8 = in_RDI;
  local_18 = ImVector<ImFont_*>::begin(local_10);
  local_20 = ImVector<ImFont_*>::end(local_10);
  for (; local_18 != local_20; local_18 = local_18 + 1) {
    local_28 = *local_18;
    PushID((void *)in_stack_ffffffffffffffa0);
    DebugNodeFont(unaff_retaddr);
    PopID();
  }
  bVar1 = TreeNode("Font Atlas","Font Atlas (%dx%d pixels)",(ulong)*(uint *)(local_8 + 0x40),
                   (ulong)*(uint *)(local_8 + 0x44));
  if (bVar1) {
    local_30 = GImGui;
    local_38 = &GImGui->DebugMetricsConfig;
    Checkbox(in_stack_000000c8,in_stack_000000c0);
    if ((local_38->ShowAtlasTintedWithTextColor & 1U) == 0) {
      ImVec4::ImVec4(&local_48,1.0,1.0,1.0,1.0);
    }
    else {
      pIVar2 = GetStyleColorVec4(0);
      local_48.x = pIVar2->x;
      local_48.y = pIVar2->y;
      local_48.z = pIVar2->z;
      local_48.w = pIVar2->w;
    }
    GetStyleColorVec4(5);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,(float)*(int *)(local_8 + 0x40),
                   (float)*(int *)(local_8 + 0x44));
    ImVec2::ImVec2(&local_68,0.0,0.0);
    ImVec2::ImVec2(&local_70,1.0,1.0);
    Image(font,(ImVec2 *)g,(ImVec2 *)cfg,(ImVec2 *)tint_col._8_8_,(ImVec4 *)tint_col._0_8_,
          (ImVec4 *)border_col._8_8_);
    TreePop();
  }
  return;
}

Assistant:

void ImGui::ShowFontAtlas(ImFontAtlas* atlas)
{
    for (ImFont* font : atlas->Fonts)
    {
        PushID(font);
        DebugNodeFont(font);
        PopID();
    }
    if (TreeNode("Font Atlas", "Font Atlas (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
    {
        ImGuiContext& g = *GImGui;
        ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
        Checkbox("Tint with Text Color", &cfg->ShowAtlasTintedWithTextColor); // Using text color ensure visibility of core atlas data, but will alter custom colored icons
        ImVec4 tint_col = cfg->ShowAtlasTintedWithTextColor ? GetStyleColorVec4(ImGuiCol_Text) : ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
        ImVec4 border_col = GetStyleColorVec4(ImGuiCol_Border);
        Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0.0f, 0.0f), ImVec2(1.0f, 1.0f), tint_col, border_col);
        TreePop();
    }
}